

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

string * __thiscall test_acc::vars_abi_cxx11_(string *__return_storage_ptr__,test_acc *this)

{
  string sStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  var_to_str_abi_cxx11_(&local_38,this->type);
  std::operator+(&local_b8,"type=",&local_38);
  std::operator+(&local_98,&local_b8,",");
  var_to_str<long,4ul>(&local_f8,&this->ne_a);
  std::operator+(&local_d8,"ne_a=",&local_f8);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,",");
  var_to_str<long,4ul>(&sStack_138,&this->ne_b);
  std::operator+(&local_118,"ne_b=",&sStack_138);
  std::operator+(__return_storage_ptr__,&local_58,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&sStack_138);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR3(type, ne_a, ne_b);
    }